

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O1

void __thiscall GrpParser::stringDefn(GrpParser *this)

{
  ASTFactory *pAVar1;
  bool bVar2;
  int iVar3;
  RefAST RVar4;
  NoViableAltException *pNVar5;
  RefAST *this_00;
  factory_type *this_01;
  RefAST tmp81_AST;
  RefAST tmp78_AST;
  ASTPair currentAST;
  RefAST stringDefn_AST;
  ASTFactory local_d8;
  ASTPair local_c8;
  ASTFactory local_b0;
  RefAST *local_a0;
  RefCount<Token> local_98;
  RefCount<AST> local_90;
  RefCount<Token> local_88;
  RefCount<Token> local_80;
  RefToken local_78;
  RefAST local_70;
  RefAST local_68;
  RefToken local_60;
  RefAST local_58;
  RefAST local_50;
  RefAST local_48;
  RefCount<Token> local_40;
  RefAST local_38;
  
  local_a0 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(local_a0,&nullAST);
  local_b0.nodeFactory = (factory_type)nullAST;
  local_c8.root.ref = (Ref *)0x0;
  local_c8.child.ref = (Ref *)0x0;
  if (nullAST.ref == (Ref *)0x0) {
    local_b0.nodeFactory = (factory_type)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  RVar4 = nullAST;
  if (iVar3 == 6) {
    if (nullAST.ref == (Ref *)0x0) {
      RVar4.ref = (Ref *)0x0;
    }
    else {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    local_d8.nodeFactory = (factory_type)RVar4.ref;
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_88,this,1);
    pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
    ASTFactory::create(&local_d8,(RefToken *)pAVar1);
    RefCount<AST>::operator=((RefCount<AST> *)&local_d8.nodeFactory,(RefCount<AST> *)&local_d8);
    RefCount<AST>::~RefCount((RefCount<AST> *)&local_d8);
    RefCount<Token>::~RefCount(&local_88);
    if ((Ref *)local_d8.nodeFactory == (Ref *)0x0) {
      local_58.ref = (Ref *)0x0;
    }
    else {
      *(uint *)((long)local_d8.nodeFactory + 8) = *(uint *)((long)local_d8.nodeFactory + 8) + 1;
      local_58.ref = (Ref *)local_d8.nodeFactory;
    }
    ASTFactory::addASTChild(pAVar1,&local_c8,&local_58);
    RefCount<AST>::~RefCount(&local_58);
    Parser::match((Parser *)this,6);
    stringDefn(this);
    local_38.ref = local_a0->ref;
    if (local_38.ref == (Ref *)0x0) {
      local_38.ref = (Ref *)0x0;
    }
    else {
      (local_38.ref)->count = (local_38.ref)->count + 1;
    }
    ASTFactory::addASTChild(pAVar1,&local_c8,&local_38);
    this_00 = &local_38;
    while( true ) {
      RefCount<AST>::~RefCount(this_00);
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      bVar2 = BitSet::member(&_tokenSet_19,iVar3);
      RVar4 = nullAST;
      if (!bVar2) break;
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      RVar4 = nullAST;
      if (iVar3 < 0x15) {
        if ((iVar3 != 6) && (iVar3 != 0x14)) {
LAB_0019580a:
          pNVar5 = (NoViableAltException *)__cxa_allocate_exception(0x40);
          (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_60,this,1);
          NoViableAltException::NoViableAltException(pNVar5,&local_60);
          __cxa_throw(pNVar5,&NoViableAltException::typeinfo,
                      NoViableAltException::~NoViableAltException);
        }
      }
      else if (iVar3 == 0x15) {
        if (nullAST.ref == (Ref *)0x0) {
          RVar4.ref = (Ref *)0x0;
        }
        else {
          (nullAST.ref)->count = (nullAST.ref)->count + 1;
        }
        local_d8._vptr_ASTFactory = (_func_int **)RVar4.ref;
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_40,this,1);
        ASTFactory::create(&local_b0,(RefToken *)pAVar1);
        RefCount<AST>::operator=((RefCount<AST> *)&local_d8,(RefCount<AST> *)&local_b0);
        RefCount<AST>::~RefCount((RefCount<AST> *)&local_b0);
        RefCount<Token>::~RefCount(&local_40);
        if ((Ref *)local_d8._vptr_ASTFactory == (Ref *)0x0) {
          local_90.ref = (Ref *)0x0;
        }
        else {
          *(uint *)((long)local_d8._vptr_ASTFactory + 8) =
               *(uint *)((long)local_d8._vptr_ASTFactory + 8) + 1;
          local_90.ref = (Ref *)local_d8._vptr_ASTFactory;
        }
        ASTFactory::addASTChild(pAVar1,&local_c8,&local_90);
        RefCount<AST>::~RefCount(&local_90);
        Parser::match((Parser *)this,0x15);
        RefCount<AST>::~RefCount((RefCount<AST> *)&local_d8);
      }
      else if (iVar3 != 0x16) goto LAB_0019580a;
      stringDefn(this);
      local_68.ref = local_a0->ref;
      if (local_68.ref == (Ref *)0x0) {
        local_68.ref = (Ref *)0x0;
      }
      else {
        (local_68.ref)->count = (local_68.ref)->count + 1;
      }
      ASTFactory::addASTChild(pAVar1,&local_c8,&local_68);
      this_00 = &local_68;
    }
    if (nullAST.ref == (Ref *)0x0) {
      RVar4.ref = (Ref *)0x0;
    }
    else {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    local_d8._vptr_ASTFactory = (_func_int **)RVar4.ref;
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_98,this,1);
    ASTFactory::create(&local_b0,(RefToken *)pAVar1);
    RefCount<AST>::operator=((RefCount<AST> *)&local_d8,(RefCount<AST> *)&local_b0);
    RefCount<AST>::~RefCount((RefCount<AST> *)&local_b0);
    RefCount<Token>::~RefCount(&local_98);
    if ((Ref *)local_d8._vptr_ASTFactory == (Ref *)0x0) {
      local_70.ref = (Ref *)0x0;
    }
    else {
      *(uint *)((long)local_d8._vptr_ASTFactory + 8) =
           *(uint *)((long)local_d8._vptr_ASTFactory + 8) + 1;
      local_70.ref = (Ref *)local_d8._vptr_ASTFactory;
    }
    ASTFactory::addASTChild(pAVar1,&local_c8,&local_70);
    RefCount<AST>::~RefCount(&local_70);
    Parser::match((Parser *)this,7);
    RefCount<AST>::~RefCount((RefCount<AST> *)&local_d8);
  }
  else {
    if (iVar3 != 0x14) {
      if (iVar3 != 0x16) {
        pNVar5 = (NoViableAltException *)__cxa_allocate_exception(0x40);
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_78,this,1);
        NoViableAltException::NoViableAltException(pNVar5,&local_78);
        __cxa_throw(pNVar5,&NoViableAltException::typeinfo,
                    NoViableAltException::~NoViableAltException);
      }
      stringFunc(this);
      local_50.ref = (this->super_LLkParser).super_Parser.returnAST.ref;
      if (local_50.ref == (Ref *)0x0) {
        local_50.ref = (Ref *)0x0;
      }
      else {
        (local_50.ref)->count = (local_50.ref)->count + 1;
      }
      ASTFactory::addASTChild(&(this->super_LLkParser).super_Parser.astFactory,&local_c8,&local_50);
      this_01 = (factory_type *)&local_50;
      goto LAB_001957b7;
    }
    if (nullAST.ref == (Ref *)0x0) {
      RVar4.ref = (Ref *)0x0;
    }
    else {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    local_d8.nodeFactory = (factory_type)RVar4.ref;
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_80,this,1);
    pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
    ASTFactory::create(&local_d8,(RefToken *)pAVar1);
    RefCount<AST>::operator=((RefCount<AST> *)&local_d8.nodeFactory,(RefCount<AST> *)&local_d8);
    RefCount<AST>::~RefCount((RefCount<AST> *)&local_d8);
    RefCount<Token>::~RefCount(&local_80);
    if ((Ref *)local_d8.nodeFactory == (Ref *)0x0) {
      local_48.ref = (Ref *)0x0;
    }
    else {
      *(uint *)((long)local_d8.nodeFactory + 8) = *(uint *)((long)local_d8.nodeFactory + 8) + 1;
      local_48.ref = (Ref *)local_d8.nodeFactory;
    }
    ASTFactory::addASTChild(pAVar1,&local_c8,&local_48);
    RefCount<AST>::~RefCount(&local_48);
    Parser::match((Parser *)this,0x14);
  }
  this_01 = &local_d8.nodeFactory;
LAB_001957b7:
  RefCount<AST>::~RefCount((RefCount<AST> *)this_01);
  RefCount<AST>::operator=((RefCount<AST> *)&local_b0.nodeFactory,&local_c8.root);
  RefCount<AST>::operator=(local_a0,(RefCount<AST> *)&local_b0.nodeFactory);
  RefCount<AST>::~RefCount((RefCount<AST> *)&local_b0.nodeFactory);
  RefCount<AST>::~RefCount(&local_c8.child);
  RefCount<AST>::~RefCount(&local_c8.root);
  return;
}

Assistant:

void GrpParser::stringDefn() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST stringDefn_AST = nullAST;
	
	try {      // for error handling
		{
		switch ( LA(1)) {
		case LIT_STRING:
		{
			RefAST tmp78_AST = nullAST;
			tmp78_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp78_AST);
			match(LIT_STRING);
			break;
		}
		case LITERAL_string:
		{
			stringFunc();
			astFactory.addASTChild(currentAST, returnAST);
			break;
		}
		case OP_LPAREN:
		{
			{
			RefAST tmp79_AST = nullAST;
			tmp79_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp79_AST);
			match(OP_LPAREN);
			stringDefn();
			astFactory.addASTChild(currentAST, returnAST);
			{
			do {
				if ((_tokenSet_19.member(LA(1)))) {
					{
					switch ( LA(1)) {
					case OP_COMMA:
					{
						RefAST tmp80_AST = nullAST;
						tmp80_AST = astFactory.create(LT(1));
						astFactory.addASTChild(currentAST, tmp80_AST);
						match(OP_COMMA);
						break;
					}
					case OP_LPAREN:
					case LIT_STRING:
					case LITERAL_string:
					{
						break;
					}
					default:
					{
						throw NoViableAltException(LT(1));
					}
					}
					}
					stringDefn();
					astFactory.addASTChild(currentAST, returnAST);
				}
				else {
					goto _loop57;
				}
				
			} while (true);
			_loop57:;
			}
			RefAST tmp81_AST = nullAST;
			tmp81_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp81_AST);
			match(OP_RPAREN);
			}
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		stringDefn_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_20);
	}
	returnAST = stringDefn_AST;
}